

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QLine *p)

{
  QDebug *pQVar1;
  QPoint other;
  char *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff4f;
  QLine *in_stack_ffffffffffffff50;
  QDebug *in_stack_ffffffffffffff68;
  QDebugStateSaver *in_stack_ffffffffffffff70;
  Stream *p_00;
  QDebug *in_stack_ffffffffffffff98;
  QDebug local_30 [2];
  QDebug local_20 [2];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  p_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<((QDebug *)in_RDI,in_RDX);
  QDebug::QDebug(local_30,pQVar1);
  QLine::p1(in_stack_ffffffffffffff50);
  operator<<(in_RSI,(QPoint *)p_00);
  pQVar1 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  QDebug::QDebug(local_20,pQVar1);
  other = QLine::p2(in_stack_ffffffffffffff50);
  operator<<(in_RSI,(QPoint *)p_00);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  QDebug::~QDebug(in_stack_ffffffffffffff98);
  QDebug::~QDebug(in_stack_ffffffffffffff98);
  QDebug::~QDebug(in_stack_ffffffffffffff98);
  QDebug::~QDebug(in_stack_ffffffffffffff98);
  QDebug::QDebug(pQVar1,(QDebug *)other);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)p_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QLine &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QLine(" << p.p1() << ',' << p.p2() << ')';
    return dbg;
}